

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::TriangleNonHeavy(Codec *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  ulong uVar6;
  bool bVar7;
  ulong *puVar8;
  ulong *puVar9;
  uint uVar10;
  Codec *in_RDI;
  uint end;
  uint ii;
  uint64_t *rem_row;
  uint ge_row_k;
  uint pivot_k;
  uint64_t row0;
  uint64_t *ge_row;
  uint ge_row_j;
  uint pivot_j;
  uint64_t *ge_matrix_offset;
  bool found;
  uint word_offset;
  uint64_t ge_mask;
  uint pivot_i;
  uint first_heavy_column;
  uint pivot_count;
  uint local_64;
  uint local_54;
  uint local_3c;
  ulong local_28;
  uint local_1c;
  
  uVar2 = in_RDI->_pivot_count;
  uVar3 = in_RDI->_first_heavy_column;
  local_1c = in_RDI->_next_pivot;
  local_28 = 1L << ((byte)local_1c & 0x3f);
  do {
    if (uVar3 <= local_1c) {
      in_RDI->_next_pivot = local_1c;
      InsertHeavyRows(in_RDI);
      return true;
    }
    uVar10 = local_1c >> 6;
    bVar7 = false;
    puVar5 = in_RDI->_ge_matrix;
    local_3c = local_1c;
    while( true ) {
      if (uVar2 <= local_3c) goto LAB_0010a6f8;
      uVar1 = in_RDI->_pivots[local_3c];
      puVar8 = puVar5 + (ulong)uVar10 + (ulong)(in_RDI->_ge_pitch * (uint)uVar1);
      if ((*puVar8 & local_28) != 0) break;
      local_3c = local_3c + 1;
    }
    bVar7 = true;
    in_RDI->_pivots[local_3c] = in_RDI->_pivots[local_1c];
    in_RDI->_pivots[local_1c] = uVar1;
    uVar6 = *puVar8;
    while (local_54 = local_3c + 1, local_54 < uVar2) {
      puVar9 = puVar5 + (ulong)uVar10 + (ulong)(in_RDI->_ge_pitch * (uint)in_RDI->_pivots[local_54])
      ;
      local_3c = local_54;
      if ((*puVar9 & local_28) != 0) {
        *puVar9 = uVar6 & (local_28 - 1 ^ 0xffffffffffffffff) ^ local_28 ^ *puVar9;
        local_64 = 1;
        uVar4 = in_RDI->_ge_pitch;
        for (; local_64 < uVar4 - uVar10; local_64 = local_64 + 1) {
          puVar9[local_64] = puVar8[local_64] ^ puVar9[local_64];
        }
      }
    }
LAB_0010a6f8:
    if (!bVar7) {
      in_RDI->_next_pivot = local_1c;
      return false;
    }
    local_28 = local_28 << 1 | local_28 >> 0x3f;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool Codec::TriangleNonHeavy()
{
    CAT_IF_DUMP(cout << endl << "---- TriangleNonHeavy ----" << endl << endl;)

    const unsigned pivot_count = _pivot_count;
    const unsigned first_heavy_column = _first_heavy_column;

    unsigned pivot_i = _next_pivot;
    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For the columns that are not protected by heavy rows:
    for (; pivot_i < first_heavy_column; ++pivot_i)
    {
        const unsigned word_offset = pivot_i >> 6;

        bool found = false;

        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;

        // For each remaining GE row that might be the pivot:
        for (unsigned pivot_j = pivot_i; pivot_j < pivot_count; ++pivot_j)
        {
            // Determine if the row contains the bit we want
            const unsigned ge_row_j = _pivots[pivot_j];

            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            // For each remaining unused row:
            for (unsigned pivot_k = pivot_j + 1; pivot_k < pivot_count; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                const unsigned ge_row_k = _pivots[pivot_k];

                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            break;
        }

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        // Generate next mask
        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    _next_pivot = pivot_i;

    InsertHeavyRows();

    return true;
}